

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoryDecoder.h
# Opt level: O1

FixedDatum *
KDIS::DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::FixedDatum>::FactoryDecode
          (KINT32 EnumVal,KDataStream *stream)

{
  FixedDatum *pFVar1;
  undefined *puVar2;
  undefined *puVar3;
  
  puVar2 = &DAT_002333b8;
  if (DAT_002333c0 != (undefined *)0x0) {
    puVar2 = &DAT_002333b8;
    puVar3 = DAT_002333c0;
    do {
      if (EnumVal <= *(int *)(puVar3 + 0x20)) {
        puVar2 = puVar3;
      }
      puVar3 = *(undefined **)(puVar3 + (ulong)(*(int *)(puVar3 + 0x20) < EnumVal) * 8 + 0x10);
    } while (puVar3 != (undefined *)0x0);
  }
  puVar3 = &DAT_002333b8;
  if ((puVar2 != &DAT_002333b8) && (puVar3 = &DAT_002333b8, *(int *)(puVar2 + 0x20) <= EnumVal)) {
    puVar3 = puVar2;
  }
  if (puVar3 != &DAT_002333b8) {
    pFVar1 = (FixedDatum *)
             (**(code **)(**(long **)(puVar3 + 0x30) + 0x10))
                       (*(long **)(puVar3 + 0x30),EnumVal,stream);
    return pFVar1;
  }
  return (FixedDatum *)0x0;
}

Assistant:

static DecoderBaseTyp *FactoryDecode(KINT32 EnumVal, KDataStream &stream) noexcept(false)
	{
		// Try to find a decoder
		typename std::map<KINT32, FacDecPtr>::iterator itr = m_mDecoders.find( EnumVal );
		if( itr != m_mDecoders.end() )
		{
			return itr->second->FactoryDecode( EnumVal, stream );
		}
		
		// No decoders found so return NULL.
		return 0;
	}